

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O0

int PsetupHeat(sunrealtype tt,N_Vector uu,N_Vector up,N_Vector rr,sunrealtype c_j,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long *in_RCX;
  double in_XMM1_Qa;
  UserData data;
  sunrealtype pelinv;
  sunrealtype *ppv;
  sunindextype mm;
  sunindextype loc;
  sunindextype offset;
  sunindextype j;
  sunindextype i;
  long local_40;
  long local_38;
  
  lVar3 = N_VGetArrayPointer(in_RCX[3]);
  lVar2 = *in_RCX;
  N_VConst(0x3ff0000000000000,in_RCX[3]);
  dVar1 = (double)in_RCX[2];
  for (local_40 = 1; local_40 < lVar2 + -1; local_40 = local_40 + 1) {
    for (local_38 = 1; local_38 < lVar2 + -1; local_38 = local_38 + 1) {
      *(double *)(lVar3 + (lVar2 * local_40 + local_38) * 8) = 1.0 / (dVar1 * 4.0 + in_XMM1_Qa);
    }
  }
  return 0;
}

Assistant:

int PsetupHeat(sunrealtype tt, N_Vector uu, N_Vector up, N_Vector rr,
               sunrealtype c_j, void* user_data)
{
  sunindextype i, j, offset, loc, mm;
  sunrealtype *ppv, pelinv;
  UserData data;

  data = (UserData)user_data;
  ppv  = N_VGetArrayPointer(data->pp);
  mm   = data->mm;

  /* Initialize the entire vector to 1., then set the interior points to the
     correct value for preconditioning. */
  N_VConst(ONE, data->pp);

  /* Compute the inverse of the preconditioner diagonal elements. */
  pelinv = ONE / (c_j + FOUR * data->coeff);

  for (j = 1; j < mm - 1; j++)
  {
    offset = mm * j;
    for (i = 1; i < mm - 1; i++)
    {
      loc      = offset + i;
      ppv[loc] = pelinv;
    }
  }

  return (0);
}